

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

cubeb_resampler *
cubeb_resampler_create_internal<short>
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  bool bVar1;
  unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> output_processor;
  uint32_t uVar2;
  cubeb_resampler_speex_one_way<short> *this;
  cubeb_resampler_speex_one_way<short> *this_00;
  delay_line<short> *pdVar3;
  cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
  *this_01;
  uint source_rate;
  int iVar4;
  _Head_base<0UL,_delay_line<short>_*,_false> input_processor;
  unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> output_delay;
  unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> input_delay;
  
  input_delay._M_t.
  super___uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>._M_t.
  super__Tuple_impl<0UL,_delay_line<short>_*,_std::default_delete<delay_line<short>_>_>.
  super__Head_base<0UL,_delay_line<short>_*,_false>._M_head_impl =
       (__uniq_ptr_data<delay_line<short>,_std::default_delete<delay_line<short>_>,_true,_true>)
       (__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>)0x0;
  output_delay._M_t.
  super___uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>._M_t.
  super__Tuple_impl<0UL,_delay_line<short>_*,_std::default_delete<delay_line<short>_>_>.
  super__Head_base<0UL,_delay_line<short>_*,_false>._M_head_impl =
       (__uniq_ptr_data<delay_line<short>,_std::default_delete<delay_line<short>_>,_true,_true>)
       (__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>)0x0;
  if (input_params == (cubeb_stream_params *)0x0) {
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_0010df38;
    this = (cubeb_resampler_speex_one_way<short> *)0x0;
    input_processor._M_head_impl = (delay_line<short> *)0x0;
LAB_0010e168:
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Resampling output (%dHz) to target and input rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x244,(ulong)output_params->rate,(ulong)target_rate);
      input_processor._M_head_impl = (delay_line<short> *)input_delay;
    }
    this_01 = (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
               *)operator_new(0x48);
    input_delay._M_t.
    super___uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>._M_t.
    super__Tuple_impl<0UL,_delay_line<short>_*,_std::default_delete<delay_line<short>_>_>.
    super__Head_base<0UL,_delay_line<short>_*,_false>._M_head_impl =
         (__uniq_ptr_data<delay_line<short>,_std::default_delete<delay_line<short>_>,_true,_true>)
         (__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>)0x0;
    cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>::
    cubeb_resampler_speex
              ((cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
                *)this_01,input_processor._M_head_impl,this,stream,callback,user_ptr);
  }
  else {
    source_rate = input_params->rate;
    if (output_params == (cubeb_stream_params *)0x0 || source_rate != target_rate) {
      if (output_params != (cubeb_stream_params *)0x0) goto LAB_0010df93;
      if (source_rate == target_rate) goto LAB_0010df3e;
      this = (cubeb_resampler_speex_one_way<short> *)0x0;
      bVar1 = false;
LAB_0010e000:
      if (source_rate == target_rate) {
LAB_0010e0b9:
        if (this == (cubeb_resampler_speex_one_way<short> *)0x0) {
          this = (cubeb_resampler_speex_one_way<short> *)0x0;
        }
        else if (bVar1 && input_params != (cubeb_stream_params *)0x0) {
          pdVar3 = (delay_line<short> *)operator_new(0x48);
          uVar2 = cubeb_resampler_speex_one_way<short>::latency(this);
          delay_line<short>::delay_line(pdVar3,uVar2,input_params->channels,output_params->rate);
          std::__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>::reset
                    ((__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_> *
                     )&input_delay,pdVar3);
          input_processor._M_head_impl = (delay_line<short> *)input_delay;
          if ((__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>)
              input_delay._M_t.
              super___uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>.
              _M_t.
              super__Tuple_impl<0UL,_delay_line<short>_*,_std::default_delete<delay_line<short>_>_>.
              super__Head_base<0UL,_delay_line<short>_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>)0x0) {
            this_00 = (cubeb_resampler_speex_one_way<short> *)0x0;
            goto LAB_0010e2fe;
          }
          goto LAB_0010e168;
        }
        input_processor._M_head_impl = (delay_line<short> *)0x0;
        goto LAB_0010e168;
      }
      this_00 = (cubeb_resampler_speex_one_way<short> *)operator_new(0x58);
      iVar4 = -1;
      if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
        iVar4 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
      }
      cubeb_resampler_speex_one_way<short>::cubeb_resampler_speex_one_way
                (this_00,input_params->channels,source_rate,target_rate,iVar4);
      if ((bool)(bVar1 & input_params != (cubeb_stream_params *)0x0 &
                this == (cubeb_resampler_speex_one_way<short> *)0x0)) {
        pdVar3 = (delay_line<short> *)operator_new(0x48);
        uVar2 = cubeb_resampler_speex_one_way<short>::latency(this_00);
        delay_line<short>::delay_line(pdVar3,uVar2,output_params->channels,output_params->rate);
        std::__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>::reset
                  ((__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)
                   &output_delay,pdVar3);
        if ((__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>)
            output_delay._M_t.
            super___uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>._M_t.
            super__Tuple_impl<0UL,_delay_line<short>_*,_std::default_delete<delay_line<short>_>_>.
            super__Head_base<0UL,_delay_line<short>_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>)0x0) {
          this = (cubeb_resampler_speex_one_way<short> *)0x0;
LAB_0010e2fe:
          this_01 = (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
                     *)0x0;
          goto LAB_0010e1d3;
        }
      }
      else if (this != (cubeb_resampler_speex_one_way<short> *)0x0) {
        if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Resampling input (%d) and output (%d) to target rate of %dHz\n",
                     "cubeb_resampler_internal.h",0x236,(ulong)input_params->rate,
                     (ulong)output_params->rate,(ulong)target_rate);
        }
        this_01 = (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
                   *)operator_new(0x48);
        cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
        ::cubeb_resampler_speex(this_01,this_00,this,stream,callback,user_ptr);
        goto LAB_0010e1cd;
      }
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Resampling input (%d) to target and output rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x23d,(ulong)input_params->rate,(ulong)target_rate);
      }
      this_01 = (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
                 *)operator_new(0x48);
      output_processor = output_delay;
      output_delay._M_t.
      super___uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>._M_t.
      super__Tuple_impl<0UL,_delay_line<short>_*,_std::default_delete<delay_line<short>_>_>.
      super__Head_base<0UL,_delay_line<short>_*,_false>._M_head_impl =
           (__uniq_ptr_data<delay_line<short>,_std::default_delete<delay_line<short>_>,_true,_true>)
           (__uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>)0x0;
      cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>::
      cubeb_resampler_speex
                ((cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
                  *)this_01,this_00,
                 (delay_line<short> *)
                 output_processor._M_t.
                 super___uniq_ptr_impl<delay_line<short>,_std::default_delete<delay_line<short>_>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_delay_line<short>_*,_std::default_delete<delay_line<short>_>_>
                 .super__Head_base<0UL,_delay_line<short>_*,_false>._M_head_impl,stream,callback,
                 user_ptr);
    }
    else {
LAB_0010df38:
      if (output_params->rate != target_rate) {
LAB_0010df93:
        uVar2 = output_params->rate;
        if (uVar2 == target_rate) {
          this = (cubeb_resampler_speex_one_way<short> *)0x0;
        }
        else {
          this = (cubeb_resampler_speex_one_way<short> *)operator_new(0x58);
          iVar4 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
          if (CUBEB_RESAMPLER_QUALITY_DESKTOP < quality) {
            iVar4 = -1;
          }
          cubeb_resampler_speex_one_way<short>::cubeb_resampler_speex_one_way
                    (this,output_params->channels,target_rate,uVar2,iVar4);
        }
        if (input_params != (cubeb_stream_params *)0x0) {
          source_rate = input_params->rate;
          bVar1 = true;
          goto LAB_0010e000;
        }
        bVar1 = true;
        goto LAB_0010e0b9;
      }
LAB_0010df3e:
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Input and output sample-rate match, target rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x206,(ulong)target_rate);
      }
      this_01 = (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
                 *)operator_new(0x48);
      if (input_params == (cubeb_stream_params *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = input_params->channels;
      }
      passthrough_resampler<short>::passthrough_resampler
                ((passthrough_resampler<short> *)this_01,stream,callback,user_ptr,uVar2,target_rate)
      ;
    }
  }
LAB_0010e1cd:
  this_00 = (cubeb_resampler_speex_one_way<short> *)0x0;
  this = (cubeb_resampler_speex_one_way<short> *)0x0;
LAB_0010e1d3:
  std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::~unique_ptr
            (&output_delay);
  std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::~unique_ptr
            (&input_delay);
  if (this != (cubeb_resampler_speex_one_way<short> *)0x0) {
    (*this->_vptr_cubeb_resampler_speex_one_way[1])(this);
  }
  if (this_00 != (cubeb_resampler_speex_one_way<short> *)0x0) {
    (*this_00->_vptr_cubeb_resampler_speex_one_way[1])(this_00);
  }
  return &this_01->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create_internal(cubeb_stream * stream,
                                cubeb_stream_params * input_params,
                                cubeb_stream_params * output_params,
                                unsigned int target_rate,
                                cubeb_data_callback callback, void * user_ptr,
                                cubeb_resampler_quality quality,
                                cubeb_resampler_reclock reclock)
{
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> input_resampler = nullptr;
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> output_resampler = nullptr;
  std::unique_ptr<delay_line<T>> input_delay = nullptr;
  std::unique_ptr<delay_line<T>> output_delay = nullptr;

  assert((input_params || output_params) &&
         "need at least one valid parameter pointer.");

  /* All the streams we have have a sample rate that matches the target
     sample rate, use a no-op resampler, that simply forwards the buffers to the
     callback. */
  if (((input_params && input_params->rate == target_rate) &&
       (output_params && output_params->rate == target_rate)) ||
      (input_params && !output_params && (input_params->rate == target_rate)) ||
      (output_params && !input_params &&
       (output_params->rate == target_rate))) {
    LOG("Input and output sample-rate match, target rate of %dHz", target_rate);
    return new passthrough_resampler<T>(
        stream, callback, user_ptr, input_params ? input_params->channels : 0,
        target_rate);
  }

  /* Determine if we need to resampler one or both directions, and create the
     resamplers. */
  if (output_params && (output_params->rate != target_rate)) {
    output_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        output_params->channels, target_rate, output_params->rate,
        to_speex_quality(quality)));
    if (!output_resampler) {
      return NULL;
    }
  }

  if (input_params && (input_params->rate != target_rate)) {
    input_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        input_params->channels, input_params->rate, target_rate,
        to_speex_quality(quality)));
    if (!input_resampler) {
      return NULL;
    }
  }

  /* If we resample only one direction but we have a duplex stream, insert a
   * delay line with a length equal to the resampler latency of the
   * other direction so that the streams are synchronized. */
  if (input_resampler && !output_resampler && input_params && output_params) {
    output_delay.reset(new delay_line<T>(input_resampler->latency(),
                                         output_params->channels,
                                         output_params->rate));
    if (!output_delay) {
      return NULL;
    }
  } else if (output_resampler && !input_resampler && input_params &&
             output_params) {
    input_delay.reset(new delay_line<T>(output_resampler->latency(),
                                        input_params->channels,
                                        output_params->rate));
    if (!input_delay) {
      return NULL;
    }
  }

  if (input_resampler && output_resampler) {
    LOG("Resampling input (%d) and output (%d) to target rate of %dHz",
        input_params->rate, output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_resampler.release(), output_resampler.release(), stream, callback,
        user_ptr);
  } else if (input_resampler) {
    LOG("Resampling input (%d) to target and output rate of %dHz",
        input_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     delay_line<T>>(input_resampler.release(),
                                                    output_delay.release(),
                                                    stream, callback, user_ptr);
  } else {
    LOG("Resampling output (%dHz) to target and input rate of %dHz",
        output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, delay_line<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_delay.release(), output_resampler.release(), stream, callback,
        user_ptr);
  }
}